

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
* __thiscall
llvm::DWARFDebugNames::NameIndex::extractAttributeEncodings
          (Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
           *__return_storage_ptr__,NameIndex *this,uint64_t *Offset)

{
  pointer *this_00;
  pointer pAVar1;
  Error local_60;
  void *pvStack_58;
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  Result;
  Expected<llvm::DWARFDebugNames::AttributeEncoding> AttrEncOr;
  
  pvStack_58 = (void *)0x0;
  Result.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Result.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &Result.
             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    extractAttributeEncoding((NameIndex *)this_00,(uint64_t *)this);
    pAVar1 = Result.
             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((AttrEncOr.field_0.TStorage.buffer[0] & 1U) != 0) {
      Result.
      super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60.Payload = (ErrorInfoBase *)((ulong)pAVar1 | 1);
      Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
      ::Expected(__return_storage_ptr__,&local_60);
      if ((long *)((ulong)local_60.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_60.Payload & 0xfffffffffffffffe) + 8))();
      }
LAB_00ad6173:
      if (((AttrEncOr.field_0.TStorage.buffer[0] & 1U) != 0) &&
         (Result.
          super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
        (**(code **)((long)*Result.
                            super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
      }
      if (pvStack_58 != (void *)0x0) {
        operator_delete(pvStack_58,
                        (long)Result.
                              super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_58);
      }
      return __return_storage_ptr__;
    }
    if (((int)Result.
              super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) &&
       (Result.
        super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ == 0)) {
      __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
      *(void **)&__return_storage_ptr__->field_0 = pvStack_58;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 8) =
           Result.
           super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x10) =
           Result.
           super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pvStack_58 = (void *)0x0;
      Result.
      super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      Result.
      super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      goto LAB_00ad6173;
    }
    std::
    vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>
    ::emplace_back<llvm::DWARFDebugNames::AttributeEncoding&>
              ((vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>
                *)&pvStack_58,(AttributeEncoding *)this_00);
    if (((AttrEncOr.field_0.TStorage.buffer[0] & 1U) != 0) &&
       (Result.
        super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
      (**(code **)((long)*Result.
                          super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
    }
  } while( true );
}

Assistant:

Expected<std::vector<DWARFDebugNames::AttributeEncoding>>
DWARFDebugNames::NameIndex::extractAttributeEncodings(uint64_t *Offset) {
  std::vector<AttributeEncoding> Result;
  for (;;) {
    auto AttrEncOr = extractAttributeEncoding(Offset);
    if (!AttrEncOr)
      return AttrEncOr.takeError();
    if (isSentinel(*AttrEncOr))
      return std::move(Result);

    Result.emplace_back(*AttrEncOr);
  }
}